

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandUtil.cpp
# Opt level: O3

string * __thiscall
llbuild::commands::util::escapedString_abi_cxx11_
          (string *__return_storage_ptr__,util *this,StringRef str)

{
  util uVar1;
  byte *__buf;
  int iVar2;
  raw_string_ostream *this_00;
  util *__n;
  util *extraout_RDX;
  util *__buf_00;
  byte bVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  StringRef Str;
  StringRef Str_00;
  raw_string_ostream resultStream;
  raw_string_ostream local_60;
  
  __n = (util *)str.Length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_60.super_raw_ostream.BufferMode = InternalBuffer;
  local_60.super_raw_ostream.OutBufStart = (char *)0x0;
  local_60.super_raw_ostream.OutBufEnd = (char *)0x0;
  local_60.super_raw_ostream.OutBufCur = (char *)0x0;
  local_60.super_raw_ostream._vptr_raw_ostream = (_func_int **)&PTR__raw_string_ostream_0020d278;
  local_60.OS = __return_storage_ptr__;
  if (str.Data != (char *)0x0) {
    pcVar4 = (char *)0x0;
    pcVar5 = (char *)0x1;
    do {
      uVar1 = this[(long)pcVar4];
      if ((char)uVar1 == 0x22) {
        pcVar4 = "\\\"";
LAB_0011e497:
        Str.Length = 2;
        Str.Data = pcVar4;
        llvm::raw_ostream::operator<<(&local_60.super_raw_ostream,Str);
      }
      else {
        iVar2 = isprint((int)(char)uVar1);
        if (iVar2 == 0) {
          if (uVar1 == (util)0xa) {
            pcVar4 = "\\n";
            goto LAB_0011e497;
          }
          Str_00.Length = 2;
          Str_00.Data = "\\x";
          this_00 = (raw_string_ostream *)
                    llvm::raw_ostream::operator<<(&local_60.super_raw_ostream,Str_00);
          bVar3 = ((byte)uVar1 >> 4) + 0x37;
          if ((byte)uVar1 < 0xa0) {
            bVar3 = ((byte)uVar1 >> 4) + 0x30;
          }
          __buf = (byte *)(this_00->super_raw_ostream).OutBufCur;
          if (__buf < (this_00->super_raw_ostream).OutBufEnd) {
            (this_00->super_raw_ostream).OutBufCur = (char *)(__buf + 1);
            *__buf = bVar3;
          }
          else {
            this_00 = (raw_string_ostream *)
                      llvm::raw_ostream::write
                                ((raw_ostream *)this_00,(uint)bVar3,__buf,(ulong)bVar3);
          }
          bVar3 = (byte)uVar1 & 0xf;
          uVar1 = (util)(bVar3 + 0x37);
          if (bVar3 < 10) {
            uVar1 = (util)(bVar3 + 0x30);
          }
          __n = (util *)(ulong)(byte)uVar1;
          __buf_00 = (util *)(this_00->super_raw_ostream).OutBufCur;
          if ((util *)(this_00->super_raw_ostream).OutBufEnd <= __buf_00) goto LAB_0011e561;
          (this_00->super_raw_ostream).OutBufCur = (char *)(__buf_00 + 1);
          *__buf_00 = uVar1;
        }
        else {
          __buf_00 = extraout_RDX;
          this_00 = &local_60;
          if (local_60.super_raw_ostream.OutBufCur < local_60.super_raw_ostream.OutBufEnd) {
            __n = (util *)(local_60.super_raw_ostream.OutBufCur + 1);
            *local_60.super_raw_ostream.OutBufCur = (char)uVar1;
            local_60.super_raw_ostream.OutBufCur = (char *)__n;
          }
          else {
LAB_0011e561:
            llvm::raw_ostream::write
                      (&this_00->super_raw_ostream,(uint)(byte)uVar1,__buf_00,(size_t)__n);
          }
        }
      }
      bVar6 = pcVar5 < str.Data;
      pcVar4 = pcVar5;
      pcVar5 = (char *)(ulong)((int)pcVar5 + 1);
    } while (bVar6);
    if (local_60.super_raw_ostream.OutBufCur != local_60.super_raw_ostream.OutBufStart) {
      llvm::raw_ostream::flush_nonempty(&local_60.super_raw_ostream);
    }
  }
  llvm::raw_string_ostream::~raw_string_ostream(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string util::escapedString(StringRef str) {
  std::string result;
  llvm::raw_string_ostream resultStream(result);
  for (unsigned i = 0; i < str.size(); ++i) {
    char c = str[i];
    if (c == '"') {
      resultStream << "\\\"";
    } else if (isprint(c)) {
      resultStream << c;
    } else if (c == '\n') {
      resultStream << "\\n";
    } else {
      resultStream << "\\x"
             << hexdigit(((unsigned char) c >> 4) & 0xF)
             << hexdigit((unsigned char) c & 0xF);
    }
  }
  resultStream.flush();
  return result;
}